

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall boost::runtime::basic_param::~basic_param(basic_param *this)

{
  undefined8 *in_RDI;
  vector<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__basic_param_00302c70;
  std::vector<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>::
  ~vector(unaff_retaddr);
  function<void_(boost::unit_test::basic_cstring<const_char>)>::~function
            ((function<void_(boost::unit_test::basic_cstring<const_char>)> *)0x26126e);
  std::__cxx11::string::~string((string *)(in_RDI + 0x11));
  std::__cxx11::string::~string((string *)(in_RDI + 0xd));
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual                 ~basic_param() {}